

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::HardSigmoid_x86_fma::forward_inplace
          (HardSigmoid_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  long lVar9;
  int iVar10;
  long *in_RSI;
  long *in_RDI;
  __m128 _ans_1;
  __m128 _p_1;
  __m128 _one;
  __m128 _zero;
  __m256 _ans;
  __m256 _p;
  __m256 _one_avx;
  __m256 _zero_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined1 local_580 [32];
  int local_4f0;
  undefined1 (*local_498) [32];
  int local_48c;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  lVar9 = in_RSI[7];
  iVar10 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
           (int)in_RSI[3];
  for (local_48c = 0; local_48c < (int)lVar9; local_48c = local_48c + 1) {
    local_498 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_48c * in_RSI[2]);
    local_4f0 = 0;
    auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
    auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
    uStack_150 = auVar4._0_8_;
    uStack_148 = auVar4._8_8_;
    for (; local_4f0 + 7 < iVar10; local_4f0 = local_4f0 + 8) {
      uVar1 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      local_580._0_16_ = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      uStack_110 = auVar4._0_8_;
      uStack_108 = auVar4._8_8_;
      local_580._16_8_ = uStack_110;
      local_580._24_8_ = uStack_108;
      uVar1 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
      uStack_d0 = auVar4._0_8_;
      uStack_c8 = auVar4._8_8_;
      auVar7._16_8_ = uStack_d0;
      auVar7._0_16_ = auVar6;
      auVar7._24_8_ = uStack_c8;
      auVar4 = vfmadd213ps_fma(auVar7,*local_498,local_580);
      auVar7 = vmaxps_avx(ZEXT1632(auVar4),ZEXT1632(ZEXT816(0)));
      auVar8._16_8_ = uStack_150;
      auVar8._0_16_ = auVar5;
      auVar8._24_8_ = uStack_148;
      auVar7 = vminps_avx(auVar7,auVar8);
      local_580._0_8_ = auVar7._0_8_;
      local_580._8_8_ = auVar7._8_8_;
      local_580._16_8_ = auVar7._16_8_;
      local_580._24_8_ = auVar7._24_8_;
      *(undefined8 *)*local_498 = local_580._0_8_;
      *(undefined8 *)(*local_498 + 8) = local_580._8_8_;
      *(undefined8 *)(*local_498 + 0x10) = local_580._16_8_;
      *(undefined8 *)(*local_498 + 0x18) = local_580._24_8_;
      local_498 = local_498 + 1;
    }
    for (; local_4f0 + 3 < iVar10; local_4f0 = local_4f0 + 4) {
      fVar2 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
      fVar3 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      local_260 = (float)*(undefined8 *)*local_498;
      fStack_25c = (float)((ulong)*(undefined8 *)*local_498 >> 0x20);
      fStack_258 = (float)*(undefined8 *)(*local_498 + 8);
      fStack_254 = (float)((ulong)*(undefined8 *)(*local_498 + 8) >> 0x20);
      local_5e0 = CONCAT44(fStack_25c * fVar3 + fVar2,local_260 * fVar3 + fVar2);
      uStack_5d8._0_4_ = fStack_258 * fVar3 + fVar2;
      uStack_5d8._4_4_ = fStack_254 * fVar3 + fVar2;
      auVar4._8_8_ = uStack_5d8;
      auVar4._0_8_ = local_5e0;
      auVar4 = vmaxps_avx(auVar4,ZEXT816(0));
      auVar5._8_8_ = 0x3f8000003f800000;
      auVar5._0_8_ = 0x3f8000003f800000;
      auVar4 = vminps_avx(auVar4,auVar5);
      local_5e0 = auVar4._0_8_;
      uStack_5d8 = auVar4._8_8_;
      *(undefined8 *)*local_498 = local_5e0;
      *(undefined8 *)(*local_498 + 8) = uStack_5d8;
      local_498 = (undefined1 (*) [32])(*local_498 + 0x10);
    }
    for (; local_4f0 < iVar10; local_4f0 = local_4f0 + 1) {
      if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= *(float *)*local_498) {
        if (*(float *)*local_498 <= *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc)) {
          *(float *)*local_498 =
               *(float *)*local_498 * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
               *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        }
        else {
          *(undefined4 *)*local_498 = 0x3f800000;
        }
      }
      else {
        *(undefined4 *)*local_498 = 0;
      }
      local_498 = (undefined1 (*) [32])(*local_498 + 4);
    }
  }
  return 0;
}

Assistant:

int HardSigmoid_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ptr++;
        }
    }

    return 0;
}